

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.h
# Opt level: O2

void __thiscall
assembler::asmcode::
add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,char_const(&)[16]>
          (asmcode *this,operation *val,operand *val_1,operand *val_2,char (*val_3) [16])

{
  operation oVar1;
  operand oVar2;
  operand oVar3;
  instruction ins;
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [64];
  
  oVar1 = *val;
  oVar2 = *val_1;
  oVar3 = *val_2;
  std::__cxx11::string::string<std::allocator<char>>(local_80,*val_3,&local_81);
  assembler::asmcode::instruction::instruction((instruction *)local_60,oVar1,oVar2,oVar3,local_80);
  std::__cxx11::string::~string(local_80);
  std::vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>::
  push_back((vector<assembler::asmcode::instruction,_std::allocator<assembler::asmcode::instruction>_>
             *)(*(long *)(*(long *)(this + 0x20) + -8) + 0x10),(value_type *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 0x20));
  return;
}

Assistant:

void add(T&&... val)
      {
      instruction ins(std::forward<T>(val)...);
      (*instructions_list_stack.back()).push_back(ins);
      }